

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf.h
# Opt level: O0

void generate_gf(void)

{
  uint uVar1;
  uint local_10;
  uint local_c;
  uint mask;
  uint i;
  
  local_10 = 1;
  alpha_of[8] = 0;
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    alpha_of[local_c] = local_10;
    index_of[alpha_of[local_c]] = local_c;
    if (p[local_c] != 0) {
      alpha_of[8] = local_10 ^ alpha_of[8];
    }
    local_10 = local_10 << 1;
  }
  index_of[alpha_of[8]] = 8;
  local_c = 9;
  while( true ) {
    uVar1 = pow2(8);
    if (uVar1 - 1 <= local_c) break;
    if (alpha_of[local_c - 1] < local_10 >> 1) {
      alpha_of[local_c] = alpha_of[local_c - 1] << 1;
    }
    else {
      alpha_of[local_c] = alpha_of[8] ^ (alpha_of[local_c - 1] ^ local_10 >> 1) << 1;
    }
    index_of[alpha_of[local_c]] = local_c;
    local_c = local_c + 1;
  }
  index_of[0] = 0xffffffff;
  return;
}

Assistant:

void generate_gf()
{
    uint32_t i, mask;

    mask = 1;
    alpha_of[m] = 0;

    for (i = 0; i < m; i++)
    {
        alpha_of[i] = mask;
        index_of[alpha_of[i]] = i;

        if (p[i] != 0)
            alpha_of[m] ^= mask;
        mask <<= 1;
    }
    index_of[alpha_of[m]] = m;
    mask >>= 1;

    for (i = m + 1; i < pow2(m) - 1; i++)
    {
        if (alpha_of[i - 1] >= mask)
            alpha_of[i] = alpha_of[m] ^ ((alpha_of[i - 1] ^ mask) << 1);
        else
            alpha_of[i] = alpha_of[i - 1] << 1;

        index_of[alpha_of[i]] = i;
    }
    index_of[0] = -1;
}